

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::_do_download(YdiskRestClient *this,string *url,ofstream *ofstream)

{
  bool bVar1;
  runtime_error *prVar2;
  long lVar3;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  shared_ptr<httplib::Response> r2;
  smatch m;
  string request_url;
  string server_url;
  string local_108;
  regex pattern;
  _Any_data local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  SSLClient cli2;
  
  server_url._M_dataplus._M_p = (pointer)&server_url.field_2;
  server_url._M_string_length = 0;
  server_url.field_2._M_local_buf[0] = '\0';
  request_url._M_dataplus._M_p = (pointer)&request_url.field_2;
  request_url._M_string_length = 0;
  request_url.field_2._M_local_buf[0] = '\0';
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m._M_begin._M_current = (char *)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"https://(.+?)(/.+)",0x10);
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (url,&m,&pattern,0);
  if (bVar1) {
    lVar3 = (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar3 == 0) || (0xfffffffffffffffd < lVar3 / 0x18 - 5U)) {
      psVar4 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    }
    else {
      psVar4 = m.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&cli2,psVar4);
    std::__cxx11::string::operator=((string *)&server_url,(string *)&cli2);
    std::__cxx11::string::~string((string *)&cli2);
    lVar3 = (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar3 == 0) || (0xfffffffffffffffc < lVar3 / 0x18 - 6U)) {
      psVar4 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
    }
    else {
      psVar4 = m.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&cli2,psVar4);
    std::__cxx11::string::operator=((string *)&request_url,(string *)&cli2);
    std::__cxx11::string::~string((string *)&cli2);
    httplib::SSLClient::SSLClient(&cli2,server_url._M_dataplus._M_p,0x1bb,300);
    local_c8._M_unused._M_object = (void *)0x0;
    local_c8._8_8_ = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    httplib::Client::Get((Client *)&r2,(char *)&cli2,(Progress *)request_url._M_dataplus._M_p);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
    if (r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->status ==
          0x12e) {
        bVar1 = httplib::Response::has_header
                          (r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"Location");
        if (!bVar1) {
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"Cannot find redirect link");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        httplib::Response::get_header_value_abi_cxx11_
                  (&local_108,
                   r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   "Location",0);
        _do_download(this,&local_108,ofstream);
        std::__cxx11::string::~string((string *)&local_108);
LAB_00155ebd:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        httplib::SSLClient::~SSLClient(&cli2);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&m);
        std::__cxx11::string::~string((string *)&request_url);
        std::__cxx11::string::~string((string *)&server_url);
        return;
      }
      if ((r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->status ==
          200) {
        std::ostream::write((char *)ofstream,
                            (long)((r2.
                                    super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->body)._M_dataplus._M_p);
        goto LAB_00155ebd;
      }
    }
    throw_response_error
              ((YdiskRestClient *)
               r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Error parsing file href for download");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::_do_download(std::string url, std::ofstream &ofstream){
    std::string server_url, request_url;

    std::smatch m;
    auto pattern = std::regex("https://(.+?)(/.+)");
    if (std::regex_search(url, m, pattern)) {
        server_url = m[1].str();
        request_url = m[2].str();
    } else {
        throw std::runtime_error("Error parsing file href for download");
    }

    httplib::SSLClient cli2(server_url.c_str());
    auto r2 = cli2.Get(request_url.c_str());
    if(r2.get() && r2->status == 200){
        ofstream.write(r2->body.data(), r2->body.size());
    } else if(r2.get() && r2->status == 302){ //redirect
        if(r2->has_header("Location"))
            _do_download(r2->get_header_value("Location"), ofstream);
        else
            throw std::runtime_error("Cannot find redirect link");
    } else {
        throw_response_error(r2.get());
    }
}